

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOptBailOut.cpp
# Opt level: O3

void __thiscall GlobOpt::FillBailOutInfo(GlobOpt *this,BasicBlock *block,BailOutInfo *bailOutInfo)

{
  OpCode OVar1;
  JitArenaAllocator *pJVar2;
  BasicBlock *pBVar3;
  Opnd *pOVar4;
  _func_int **pp_Var5;
  code *pcVar6;
  GlobOpt *pGVar7;
  bool bVar8;
  OpndKind OVar9;
  uint uVar10;
  BOOL BVar11;
  uint uVar12;
  undefined4 *puVar13;
  BVSparse<Memory::JitArenaAllocator> *pBVar14;
  BVSparse<Memory::JitArenaAllocator> *this_00;
  StartCallInfo *pSVar15;
  Func **ppFVar16;
  StackSym **__s;
  Type *ppOVar17;
  StackSym *pSVar18;
  Value *pVVar19;
  uint uVar20;
  uint uVar21;
  long lVar22;
  SListBase<IR::Opnd_*,_Memory::ArenaAllocator,_RealCount> *pSVar23;
  BasicBlock *block_00;
  ulong uVar24;
  int iVar25;
  StackLiteralBailOutInfo *pSVar26;
  uint uVar27;
  size_t requestedBytes;
  BasicBlock *block_01;
  Iterator local_78;
  BasicBlock *local_68;
  BasicBlock *local_60;
  BVSparse<Memory::JitArenaAllocator> *local_58;
  BailOutInfo *local_50;
  StackLiteralBailOutInfo *local_48;
  GlobOpt *local_40;
  uint local_34;
  
  local_40 = this;
  if ((this->field_0xf4 & 1) != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar13 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar13 = 1;
    bVar8 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBailOut.cpp"
                       ,0x3c7,"(!this->isCallHelper)",
                       "Bail out can\'t be inserted the middle of CallHelper sequence");
    if (!bVar8) goto LAB_0048cce0;
    *puVar13 = 0;
  }
  pGVar7 = local_40;
  pBVar14 = BVSparse<Memory::JitArenaAllocator>::CopyNew
                      ((block->globOptData).liveVarSyms,local_40->func->m_alloc);
  bailOutInfo->liveVarSyms = pBVar14;
  pBVar14 = BVSparse<Memory::JitArenaAllocator>::CopyNew
                      ((block->globOptData).liveFloat64Syms,pGVar7->func->m_alloc);
  bailOutInfo->liveFloat64Syms = pBVar14;
  block_00 = (BasicBlock *)(block->globOptData).liveInt32Syms;
  pBVar14 = (block->globOptData).liveLossyInt32Syms;
  pJVar2 = pGVar7->func->m_alloc;
  local_60 = block;
  this_00 = (BVSparse<Memory::JitArenaAllocator> *)
            new<Memory::JitArenaAllocator>(0x20,pJVar2,0x3eba5c);
  block_01 = local_60;
  this_00->head = (Type_conflict)0x0;
  this_00->lastFoundIndex = (Type_conflict)0x0;
  this_00->alloc = pJVar2;
  this_00->lastUsedNodePrevNextField = (Type)this_00;
  BVSparse<Memory::JitArenaAllocator>::for_each<&BVUnitT<unsigned_long>::Minus>
            (this_00,(BVSparse<Memory::JitArenaAllocator> *)block_00,pBVar14);
  bailOutInfo->liveLosslessInt32Syms = this_00;
  pBVar3 = (BasicBlock *)(block_01->globOptData).stackLiteralInitFldDataMap;
  if ((pBVar3 != (BasicBlock *)0x0) &&
     (uVar10 = *(int *)&pBVar3->liveFixedFields - *(int *)&pBVar3->upwardExposedUses, uVar10 != 0))
  {
    pJVar2 = local_40->func->m_alloc;
    local_68 = pBVar3;
    local_34 = uVar10;
    BVar11 = ExceptionCheck::CanHandleOutOfMemory();
    if (BVar11 == 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar13 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar13 = 1;
      bVar8 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                         ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                         "ExceptionCheck::CanHandleOutOfMemory()");
      if (!bVar8) goto LAB_0048cce0;
      *puVar13 = 0;
    }
    block_00 = (BasicBlock *)((ulong)local_34 << 4);
    local_48 = (StackLiteralBailOutInfo *)
               Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
               AllocInternal((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)
                             pJVar2,(size_t)block_00);
    if (local_48 == (StackLiteralBailOutInfo *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar13 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar13 = 1;
      block_00 = (BasicBlock *)0x1fe;
      bVar8 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                         ,0x1fe,"(buffer != nullptr)","buffer != nullptr");
      if (!bVar8) goto LAB_0048cce0;
      *puVar13 = 0;
    }
    uVar10 = *(uint *)&local_68->field_0x1c;
    uVar27 = 0;
    uVar21 = local_34;
    local_50 = bailOutInfo;
    if (uVar10 != 0) {
      puVar13 = (undefined4 *)__tls_get_addr();
      uVar24 = 0;
      block_00 = local_68;
      uVar21 = local_34;
      do {
        iVar25 = *(int *)((long)&block_00->next->next + uVar24 * 4);
        if (iVar25 != -1) {
          do {
            pBVar3 = block_00->prev;
            lVar22 = (long)iVar25;
            iVar25 = (int)((Type *)&pBVar3->loop)[lVar22 * 4].word;
            pSVar18 = *(StackSym **)(&pBVar3->field_0x18 + lVar22 * 0x20);
            if (uVar21 <= uVar27) {
              local_58 = (BVSparse<Memory::JitArenaAllocator> *)CONCAT44(local_58._4_4_,iVar25);
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              *puVar13 = 1;
              bVar8 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBailOut.cpp"
                                 ,0x3e2,"(i < stackLiteralInitFldDataCount)",
                                 "i < stackLiteralInitFldDataCount");
              if (!bVar8) goto LAB_0048cce0;
              *puVar13 = 0;
              block_00 = local_68;
              uVar21 = local_34;
              iVar25 = (int)local_58;
            }
            local_48[uVar27].stackSym = pSVar18;
            local_48[uVar27].initFldCount = *(Type *)(&pBVar3->prev + lVar22 * 4);
            uVar27 = uVar27 + 1;
          } while (iVar25 != -1);
          uVar10 = *(uint *)&block_00->field_0x1c;
        }
        uVar24 = uVar24 + 1;
      } while (uVar24 < uVar10);
    }
    bailOutInfo = local_50;
    block_01 = local_60;
    if (uVar27 != uVar21) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar13 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar13 = 1;
      block_00 = (BasicBlock *)0x3e8;
      bVar8 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBailOut.cpp"
                         ,1000,"(i == stackLiteralInitFldDataCount)",
                         "i == stackLiteralInitFldDataCount");
      if (!bVar8) goto LAB_0048cce0;
      *puVar13 = 0;
      uVar21 = local_34;
    }
    bailOutInfo->stackLiteralBailOutInfoCount = uVar21;
    bailOutInfo->stackLiteralBailOutInfo = local_48;
  }
  bVar8 = TrackArgumentsObject(local_40);
  if (bVar8) {
    CaptureArguments(local_40,block_00,bailOutInfo,local_40->func->m_alloc);
  }
  pGVar7 = local_40;
  pSVar23 = (block_01->globOptData).callSequence;
  if ((pSVar23 == (SListBase<IR::Opnd_*,_Memory::ArenaAllocator,_RealCount> *)0x0) ||
     ((SListBase<IR::Opnd_*,_Memory::ArenaAllocator,_RealCount> *)
      (pSVar23->super_SListNodeBase<Memory::ArenaAllocator>).next == pSVar23)) {
    pBVar14 = (BVSparse<Memory::JitArenaAllocator> *)0x0;
LAB_0048ccc2:
    CaptureValues(local_40,block_01,bailOutInfo,pBVar14);
    return;
  }
  uVar10 = (block_01->globOptData).startCallCount;
  pSVar26 = (StackLiteralBailOutInfo *)(ulong)uVar10;
  local_48 = pSVar26;
  if (pSVar26 == (StackLiteralBailOutInfo *)0x0) {
    bailOutInfo->startCallInfo = (StartCallInfo *)&DAT_00000008;
    bailOutInfo->startCallCount = 0;
    ppFVar16 = (Func **)&DAT_00000008;
  }
  else {
    pSVar15 = (StartCallInfo *)
              new__<Memory::JitArenaAllocator>((long)pSVar26 * 4,local_40->func->m_alloc,0x3eba5c);
    bailOutInfo->startCallInfo = pSVar15;
    bailOutInfo->startCallCount = uVar10;
    ppFVar16 = (Func **)new__<Memory::JitArenaAllocator>
                                  ((long)pSVar26 << 3,pGVar7->func->m_alloc,0x3eba5c);
  }
  bailOutInfo->startCallFunc = ppFVar16;
  uVar10 = (block_01->globOptData).totalOutParamCount;
  uVar24 = (ulong)uVar10;
  bailOutInfo->totalOutParamCount = uVar10;
  if (uVar24 == 0) {
    __s = (StackSym **)&DAT_00000008;
  }
  else {
    pJVar2 = local_40->func->m_alloc;
    BVar11 = ExceptionCheck::CanHandleOutOfMemory();
    if (BVar11 == 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar13 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar13 = 1;
      bVar8 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                         ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                         "ExceptionCheck::CanHandleOutOfMemory()");
      if (!bVar8) goto LAB_0048cce0;
      *puVar13 = 0;
    }
    requestedBytes = uVar24 * 8;
    __s = (StackSym **)
          Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::AllocInternal
                    ((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)pJVar2,
                     requestedBytes);
    memset(__s,0,requestedBytes);
    memset(__s + uVar24,0,(requestedBytes + 0xf & 0xfffffffffffffff0) + uVar24 * -8);
    if (__s == (StackSym **)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar13 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar13 = 1;
      bVar8 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                         ,0x1fe,"(buffer != nullptr)","buffer != nullptr");
      if (!bVar8) goto LAB_0048cce0;
      *puVar13 = 0;
      __s = (StackSym **)0x0;
    }
  }
  bailOutInfo->argOutSyms = __s;
  pSVar23 = (local_60->globOptData).callSequence;
  uVar10 = 0;
  local_78.list = pSVar23;
  local_78.current = &pSVar23->super_SListNodeBase<Memory::ArenaAllocator>;
  local_50 = bailOutInfo;
  puVar13 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
  local_58 = (BVSparse<Memory::JitArenaAllocator> *)0x0;
  while( true ) {
    if (pSVar23 == (SListBase<IR::Opnd_*,_Memory::ArenaAllocator,_RealCount> *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar13 = 1;
      bVar8 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                         ,0x76,"(current != nullptr)","current != nullptr");
      if (!bVar8) goto LAB_0048cce0;
      *puVar13 = 0;
      pSVar23 = (SListBase<IR::Opnd_*,_Memory::ArenaAllocator,_RealCount> *)local_78.current;
    }
    pSVar26 = local_48;
    block_01 = local_60;
    pSVar23 = (SListBase<IR::Opnd_*,_Memory::ArenaAllocator,_RealCount> *)
              (pSVar23->super_SListNodeBase<Memory::ArenaAllocator>).next;
    uVar21 = (uint)uVar24;
    if (pSVar23 == local_78.list) break;
    local_78.current = (NodeBase *)pSVar23;
    ppOVar17 = SListBase<IR::Opnd_*,_Memory::ArenaAllocator,_RealCount>::Iterator::Data(&local_78);
    pSVar18 = IR::Opnd::GetStackSym(*ppOVar17);
    uVar27 = *(uint *)&pSVar18->field_0x18;
    OVar9 = IR::Opnd::GetKind(*ppOVar17);
    if ((uVar27 & 0x300000) == 0) {
      if (OVar9 != OpndKindReg) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar13 = 1;
        bVar8 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBailOut.cpp"
                           ,0x42d,"(opnd->IsRegOpnd())","opnd->IsRegOpnd()");
        if (!bVar8) goto LAB_0048cce0;
        *puVar13 = 0;
      }
      pOVar4 = *ppOVar17;
      OVar9 = IR::Opnd::GetKind(pOVar4);
      if (OVar9 != OpndKindReg) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar13 = 1;
        bVar8 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                           ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
        if (!bVar8) goto LAB_0048cce0;
        *puVar13 = 0;
      }
      pSVar26 = local_48;
      pp_Var5 = pOVar4[1]._vptr_Opnd;
      uVar27 = *(uint *)(pp_Var5 + 3);
      uVar20 = uVar27 & 0x100000;
      if ((uVar20 != 0) && (*(short *)((long)pp_Var5 + 0x16) == 0)) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar13 = 1;
        bVar8 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Sym.inl"
                           ,0x5b,"(this->m_slotNum != 0)","this->m_slotNum != 0");
        if (!bVar8) goto LAB_0048cce0;
        *puVar13 = 0;
        uVar27 = *(uint *)(pp_Var5 + 3);
        uVar20 = uVar27 & 0x100000;
      }
      if (uVar20 != 0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar13 = 1;
        bVar8 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBailOut.cpp"
                           ,0x42f,"(!sym->IsArgSlotSym())","!sym->IsArgSlotSym()");
        if (!bVar8) goto LAB_0048cce0;
        *puVar13 = 0;
        uVar27 = *(uint *)(pp_Var5 + 3);
      }
      if ((uVar27 & 1) == 0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar13 = 1;
        bVar8 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBailOut.cpp"
                           ,0x430,"(sym->m_isSingleDef)","sym->m_isSingleDef");
        if (!bVar8) goto LAB_0048cce0;
        *puVar13 = 0;
      }
      if (*(short *)(pp_Var5[5] + 0x30) != 7) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar13 = 1;
        bVar8 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBailOut.cpp"
                           ,0x431,"(sym->m_instrDef->m_opcode == Js::OpCode::StartCall)",
                           "sym->m_instrDef->m_opcode == Js::OpCode::StartCall");
        if (!bVar8) goto LAB_0048cce0;
        *puVar13 = 0;
      }
      if ((int)pSVar26 == 0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar13 = 1;
        bVar8 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBailOut.cpp"
                           ,0x433,"(startCallNumber != 0)","startCallNumber != 0");
        if (!bVar8) goto LAB_0048cce0;
        *puVar13 = 0;
      }
      local_48 = (StackLiteralBailOutInfo *)(ulong)((int)pSVar26 - 1);
      local_50->startCallFunc[(long)local_48] = *(Func **)(pp_Var5[5] + 0x20);
      uVar12 = IR::Instr::GetArgOutCount((Instr *)pp_Var5[5],true);
      uVar24 = (ulong)(uVar21 - uVar12);
      if (uVar21 < uVar12) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar13 = 1;
        bVar8 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBailOut.cpp"
                           ,0x43e,"(totalOutParamCount >= argOutCount)",
                           "totalOutParamCount >= argOutCount");
        if (!bVar8) goto LAB_0048cce0;
        *puVar13 = 0;
      }
      pSVar26 = local_48;
      if (uVar12 < uVar10) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar13 = 1;
        bVar8 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBailOut.cpp"
                           ,0x43f,"(argOutCount >= currentArgOutCount)",
                           "argOutCount >= currentArgOutCount");
        if (!bVar8) goto LAB_0048cce0;
        *puVar13 = 0;
      }
      BailOutInfo::RecordStartCallInfo(local_50,(uint)pSVar26,(Instr *)pp_Var5[5]);
      uVar10 = 0;
      pSVar23 = (SListBase<IR::Opnd_*,_Memory::ArenaAllocator,_RealCount> *)local_78.current;
    }
    else {
      pOVar4 = *ppOVar17;
      if (OVar9 == OpndKindSym) {
        OVar9 = IR::Opnd::GetKind(pOVar4);
        if (OVar9 != OpndKindSym) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar13 = 1;
          bVar8 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                             ,0x45,"(this->IsSymOpnd())","Bad call to AsSymOpnd()");
          if (!bVar8) goto LAB_0048cce0;
          *puVar13 = 0;
        }
        pSVar18 = (StackSym *)pOVar4[1]._vptr_Opnd;
        if ((pSVar18->super_Sym).m_kind != SymKindStack) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar13 = 1;
          bVar8 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Sym.inl"
                             ,0x1f,"(this->IsStackSym())","Bad call to AsStackSym()");
          if (!bVar8) goto LAB_0048cce0;
          *puVar13 = 0;
        }
        uVar27 = *(uint *)&pSVar18->field_0x18;
        uVar20 = uVar27 & 0x100000;
        if ((uVar20 != 0) && (*(short *)&(pSVar18->super_Sym).field_0x16 == 0)) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar13 = 1;
          bVar8 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Sym.inl"
                             ,0x5b,"(this->m_slotNum != 0)","this->m_slotNum != 0");
          if (!bVar8) goto LAB_0048cce0;
          *puVar13 = 0;
          uVar27 = *(uint *)&pSVar18->field_0x18;
          uVar20 = uVar27 & 0x100000;
        }
        if (uVar20 == 0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar13 = 1;
          bVar8 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBailOut.cpp"
                             ,0x40d,"(sym->IsArgSlotSym())","sym->IsArgSlotSym()");
          if (!bVar8) goto LAB_0048cce0;
          *puVar13 = 0;
          uVar27 = *(uint *)&pSVar18->field_0x18;
        }
        if ((uVar27 & 1) == 0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar13 = 1;
          bVar8 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBailOut.cpp"
                             ,0x40e,"(sym->m_isSingleDef)","sym->m_isSingleDef");
          if (!bVar8) goto LAB_0048cce0;
          *puVar13 = 0;
        }
        OVar1 = ((pSVar18->field_5).m_instrDef)->m_opcode;
        uVar27 = OVar1 - 0x1ed;
        if (((6 < uVar27) || ((0x4bU >> (uVar27 & 0x1f) & 1) == 0)) && (OVar1 != ArgOut_A)) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar13 = 1;
          bVar8 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBailOut.cpp"
                             ,0x413,
                             "(sym->m_instrDef->m_opcode == Js::OpCode::ArgOut_A || sym->m_instrDef->m_opcode == Js::OpCode::ArgOut_A_Inline || sym->m_instrDef->m_opcode == Js::OpCode::ArgOut_A_InlineBuiltIn || sym->m_instrDef->m_opcode == Js::OpCode::ArgOut_A_SpreadArg || sym->m_instrDef->m_opcode == Js::OpCode::ArgOut_A_Dynamic)"
                             ,
                             "sym->m_instrDef->m_opcode == Js::OpCode::ArgOut_A || sym->m_instrDef->m_opcode == Js::OpCode::ArgOut_A_Inline || sym->m_instrDef->m_opcode == Js::OpCode::ArgOut_A_InlineBuiltIn || sym->m_instrDef->m_opcode == Js::OpCode::ArgOut_A_SpreadArg || sym->m_instrDef->m_opcode == Js::OpCode::ArgOut_A_Dynamic"
                            );
          if (!bVar8) goto LAB_0048cce0;
          *puVar13 = 0;
        }
      }
      else {
        pSVar18 = IR::Opnd::GetStackSym(pOVar4);
        pVVar19 = GlobOptBlockData::FindValue
                            (&local_40->currentBlock->globOptData,&pSVar18->super_Sym);
        if (pVVar19 == (Value *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar13 = 1;
          bVar8 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBailOut.cpp"
                             ,0x418,"(this->currentBlock->globOptData.FindValue(sym))",
                             "this->currentBlock->globOptData.FindValue(sym)");
          if (!bVar8) goto LAB_0048cce0;
          *puVar13 = 0;
        }
        pGVar7 = local_40;
        if (local_58 == (BVSparse<Memory::JitArenaAllocator> *)0x0) {
          local_58 = (BVSparse<Memory::JitArenaAllocator> *)
                     new<Memory::JitArenaAllocator>(0x20,local_40->tempAlloc,0x3eba5c);
          pJVar2 = pGVar7->tempAlloc;
          local_58->head = (Type_conflict)0x0;
          local_58->lastFoundIndex = (Type_conflict)0x0;
          local_58->alloc = pJVar2;
          local_58->lastUsedNodePrevNextField = (Type)local_58;
        }
        BVSparse<Memory::JitArenaAllocator>::Set(local_58,(pSVar18->super_Sym).m_id);
      }
      if (uVar21 == 0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar13 = 1;
        bVar8 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBailOut.cpp"
                           ,0x422,"(totalOutParamCount != 0)","totalOutParamCount != 0");
        if (!bVar8) goto LAB_0048cce0;
        *puVar13 = 0;
      }
      if (uVar21 <= uVar10) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar13 = 1;
        bVar8 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBailOut.cpp"
                           ,0x423,"(totalOutParamCount > currentArgOutCount)",
                           "totalOutParamCount > currentArgOutCount");
        if (!bVar8) goto LAB_0048cce0;
        *puVar13 = 0;
      }
      uVar10 = uVar10 + 1;
      local_50->argOutSyms[uVar21 - uVar10] = pSVar18;
      pSVar23 = (SListBase<IR::Opnd_*,_Memory::ArenaAllocator,_RealCount> *)local_78.current;
    }
  }
  if (uVar21 != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *puVar13 = 1;
    bVar8 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBailOut.cpp"
                       ,0x448,"(totalOutParamCount == 0)","totalOutParamCount == 0");
    if (!bVar8) goto LAB_0048cce0;
    *puVar13 = 0;
  }
  if ((int)pSVar26 != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *puVar13 = 1;
    bVar8 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBailOut.cpp"
                       ,0x449,"(startCallNumber == 0)","startCallNumber == 0");
    if (!bVar8) goto LAB_0048cce0;
    *puVar13 = 0;
  }
  pBVar14 = local_58;
  bailOutInfo = local_50;
  if (uVar10 == 0) goto LAB_0048ccc2;
  AssertCount = AssertCount + 1;
  Js::Throw::LogAssert();
  *puVar13 = 1;
  bVar8 = Js::Throw::ReportAssert
                    ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBailOut.cpp"
                     ,0x44a,"(currentArgOutCount == 0)","currentArgOutCount == 0");
  if (bVar8) {
    *puVar13 = 0;
    pBVar14 = local_58;
    bailOutInfo = local_50;
    goto LAB_0048ccc2;
  }
LAB_0048cce0:
  pcVar6 = (code *)invalidInstructionException();
  (*pcVar6)();
}

Assistant:

void
GlobOpt::FillBailOutInfo(BasicBlock *block, BailOutInfo * bailOutInfo)
{
    AssertMsg(!this->isCallHelper, "Bail out can't be inserted the middle of CallHelper sequence");

    BVSparse<JitArenaAllocator>* argsToCapture = nullptr;

    bailOutInfo->liveVarSyms = block->globOptData.liveVarSyms->CopyNew(this->func->m_alloc);
    bailOutInfo->liveFloat64Syms = block->globOptData.liveFloat64Syms->CopyNew(this->func->m_alloc);
    // The live int32 syms in the bailout info are only the syms resulting from lossless conversion to int. If the int32 value
    // was created from a lossy conversion to int, the original var value cannot be re-materialized from the int32 value. So, the
    // int32 version is considered to be not live for the purposes of bailout, which forces the var or float versions to be used
    // directly for restoring the value during bailout. Otherwise, bailout may try to re-materialize the var value by converting
    // the lossily-converted int value back into a var, restoring the wrong value.
    bailOutInfo->liveLosslessInt32Syms =
        block->globOptData.liveInt32Syms->MinusNew(block->globOptData.liveLossyInt32Syms, this->func->m_alloc);

    // Save the stack literal init field count so we can null out the uninitialized fields
    StackLiteralInitFldDataMap * stackLiteralInitFldDataMap = block->globOptData.stackLiteralInitFldDataMap;
    if (stackLiteralInitFldDataMap != nullptr)
    {
        uint stackLiteralInitFldDataCount = stackLiteralInitFldDataMap->Count();
        if (stackLiteralInitFldDataCount != 0)
        {
            auto stackLiteralBailOutInfo = AnewArray(this->func->m_alloc,
                BailOutInfo::StackLiteralBailOutInfo, stackLiteralInitFldDataCount);
            uint i = 0;
            stackLiteralInitFldDataMap->Map(
                [stackLiteralBailOutInfo, stackLiteralInitFldDataCount, &i](StackSym * stackSym, StackLiteralInitFldData const& data)
            {
                Assert(i < stackLiteralInitFldDataCount);
                stackLiteralBailOutInfo[i].stackSym = stackSym;
                stackLiteralBailOutInfo[i].initFldCount = data.currentInitFldCount;
                i++;
            });

            Assert(i == stackLiteralInitFldDataCount);
            bailOutInfo->stackLiteralBailOutInfoCount = stackLiteralInitFldDataCount;
            bailOutInfo->stackLiteralBailOutInfo = stackLiteralBailOutInfo;
        }
    }

    if (TrackArgumentsObject())
    {
        this->CaptureArguments(block, bailOutInfo, this->func->m_alloc);
    }

    if (block->globOptData.callSequence && !block->globOptData.callSequence->Empty())
    {
        uint currentArgOutCount = 0;
        uint startCallNumber = block->globOptData.startCallCount;

        bailOutInfo->startCallInfo = JitAnewArray(this->func->m_alloc, BailOutInfo::StartCallInfo, startCallNumber);
        bailOutInfo->startCallCount = startCallNumber;

        // Save the start call's func to identify the function (inlined) that the call sequence is for
        // We might not have any arg out yet to get the function from
        bailOutInfo->startCallFunc = JitAnewArray(this->func->m_alloc, Func *, startCallNumber);
#ifdef _M_IX86
        bailOutInfo->inlinedStartCall = BVFixed::New(startCallNumber, this->func->m_alloc, false);
#endif
        uint totalOutParamCount = block->globOptData.totalOutParamCount;
        bailOutInfo->totalOutParamCount = totalOutParamCount;
        bailOutInfo->argOutSyms = JitAnewArrayZ(this->func->m_alloc, StackSym *, totalOutParamCount);

        FOREACH_SLISTBASE_ENTRY(IR::Opnd *, opnd, block->globOptData.callSequence)
        {
            if(opnd->GetStackSym()->HasArgSlotNum())
            {
                StackSym * sym;
                if(opnd->IsSymOpnd())
                {
                    sym = opnd->AsSymOpnd()->m_sym->AsStackSym();
                    Assert(sym->IsArgSlotSym());
                    Assert(sym->m_isSingleDef);
                    Assert(sym->m_instrDef->m_opcode == Js::OpCode::ArgOut_A
                        || sym->m_instrDef->m_opcode == Js::OpCode::ArgOut_A_Inline
                        || sym->m_instrDef->m_opcode == Js::OpCode::ArgOut_A_InlineBuiltIn
                        || sym->m_instrDef->m_opcode == Js::OpCode::ArgOut_A_SpreadArg
                        || sym->m_instrDef->m_opcode == Js::OpCode::ArgOut_A_Dynamic);
                }
                else
                {
                    sym = opnd->GetStackSym();
                    Assert(this->currentBlock->globOptData.FindValue(sym));
                    // StackSym args need to be re-captured
                    if (!argsToCapture)
                    {
                        argsToCapture = JitAnew(this->tempAlloc, BVSparse<JitArenaAllocator>, this->tempAlloc);
                    }

                    argsToCapture->Set(sym->m_id);
                }

                Assert(totalOutParamCount != 0);
                Assert(totalOutParamCount > currentArgOutCount);
                currentArgOutCount++;
#pragma prefast(suppress:26000, "currentArgOutCount is never 0");
                bailOutInfo->argOutSyms[totalOutParamCount - currentArgOutCount] = sym;
                // Note that there could be ArgOuts below current bailout instr that belong to current call (currentArgOutCount < argOutCount),
                // in which case we will have nulls in argOutSyms[] in start of section for current call, because we fill from tail.
                // Example: StartCall 3, ArgOut1,.. ArgOut2, Bailout,.. Argout3 -> [NULL, ArgOut1, ArgOut2].
            }
            else
            {
                Assert(opnd->IsRegOpnd());
                StackSym * sym = opnd->AsRegOpnd()->m_sym;
                Assert(!sym->IsArgSlotSym());
                Assert(sym->m_isSingleDef);
                Assert(sym->m_instrDef->m_opcode == Js::OpCode::StartCall);

                Assert(startCallNumber != 0);
                startCallNumber--;

                bailOutInfo->startCallFunc[startCallNumber] = sym->m_instrDef->m_func;
#ifdef _M_IX86
                if (sym->m_isInlinedArgSlot)
                {
                    bailOutInfo->inlinedStartCall->Set(startCallNumber);
                }
#endif
                uint argOutCount = sym->m_instrDef->GetArgOutCount(/*getInterpreterArgOutCount*/ true);
                Assert(totalOutParamCount >= argOutCount);
                Assert(argOutCount >= currentArgOutCount);

                bailOutInfo->RecordStartCallInfo(startCallNumber, sym->m_instrDef);
                totalOutParamCount -= argOutCount;
                currentArgOutCount = 0;
            }
        }
        NEXT_SLISTBASE_ENTRY;

        Assert(totalOutParamCount == 0);
        Assert(startCallNumber == 0);
        Assert(currentArgOutCount == 0);
    }

    // Save the constant values that we know so we can restore them directly.
    // This allows us to dead store the constant value assign.
    this->CaptureValues(block, bailOutInfo, argsToCapture);
}